

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O1

void nghttp3_qpack_decoder_init
               (nghttp3_qpack_decoder *decoder,size_t hard_max_dtable_capacity,
               size_t max_blocked_streams,nghttp3_mem *mem)

{
  nghttp3_ringbuf_init((nghttp3_ringbuf *)decoder,0,8,mem);
  (decoder->ctx).mem = mem;
  (decoder->ctx).dtable_size = 0;
  (decoder->ctx).dtable_sum = 0;
  (decoder->ctx).hard_max_dtable_capacity = hard_max_dtable_capacity;
  (decoder->ctx).max_dtable_capacity = 0;
  (decoder->ctx).max_blocked_streams = max_blocked_streams;
  (decoder->ctx).next_absidx = 0;
  (decoder->ctx).bad = '\0';
  decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
  decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED;
  (decoder->rstate).name = (nghttp3_rcbuf *)0x0;
  (decoder->rstate).value = (nghttp3_rcbuf *)0x0;
  decoder->written_icnt = 0;
  decoder->max_concurrent_streams = 0;
  decoder->uninterrupted_encoderlen = 0;
  nghttp3_buf_init(&(decoder->rstate).namebuf);
  nghttp3_buf_init(&(decoder->rstate).valuebuf);
  *(undefined8 *)((long)&(decoder->rstate).absidx + 4) = 0;
  (decoder->rstate).dynamic = 0;
  (decoder->rstate).huffman_encoded = 0;
  (decoder->rstate).shift = 0;
  (decoder->rstate).absidx = 0;
  (decoder->rstate).left = 0;
  (decoder->rstate).prefix = 0;
  nghttp3_buf_init(&decoder->dbuf);
  return;
}

Assistant:

void nghttp3_qpack_decoder_init(nghttp3_qpack_decoder *decoder,
                                size_t hard_max_dtable_capacity,
                                size_t max_blocked_streams,
                                const nghttp3_mem *mem) {
  qpack_context_init(&decoder->ctx, hard_max_dtable_capacity,
                     max_blocked_streams, mem);

  decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
  decoder->opcode = 0;
  decoder->written_icnt = 0;
  decoder->max_concurrent_streams = 0;
  decoder->uninterrupted_encoderlen = 0;

  nghttp3_qpack_read_state_reset(&decoder->rstate);
  nghttp3_buf_init(&decoder->dbuf);
}